

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O3

Snapshot * __thiscall
cmState::Snapshot::GetBuildsystemDirectoryParent(Snapshot *__return_storage_ptr__,Snapshot *this)

{
  bool bVar1;
  PointerType pSVar2;
  iterator other;
  iterator other_00;
  PositionType parentPos;
  iterator local_28;
  
  __return_storage_ptr__->State = (cmState *)0x0;
  (__return_storage_ptr__->Position).Tree = (cmLinkedTree<cmState::SnapshotDataType> *)0x0;
  (__return_storage_ptr__->Position).Position = 0;
  if (this->State != (cmState *)0x0) {
    other.Tree = &this->State->SnapshotData;
    other.Position = 0;
    bVar1 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator==(&this->Position,other);
    if (!bVar1) {
      pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&this->Position);
      local_28.Tree = (pSVar2->DirectoryParent).Tree;
      local_28.Position = (pSVar2->DirectoryParent).Position;
      other_00.Tree = &this->State->SnapshotData;
      other_00.Position = 0;
      bVar1 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator!=(&local_28,other_00);
      if (bVar1) {
        __return_storage_ptr__->State = this->State;
        (__return_storage_ptr__->Position).Tree = local_28.Tree;
        (__return_storage_ptr__->Position).Position = local_28.Position;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

cmState::Snapshot cmState::Snapshot::GetBuildsystemDirectoryParent() const
{
  Snapshot snapshot;
  if (!this->State || this->Position == this->State->SnapshotData.Root())
    {
    return snapshot;
    }
  PositionType parentPos = this->Position->DirectoryParent;
  if (parentPos != this->State->SnapshotData.Root())
    {
    snapshot = Snapshot(this->State, parentPos);
    }

  return snapshot;
}